

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::MapFieldLite<int,_proto2_unittest::TestAllTypesLite>::~MapFieldLite
          (MapFieldLite<int,_proto2_unittest::TestAllTypesLite> *this)

{
  void *v1;
  anon_union_32_1_898eb381_for_MapFieldLite<int,_proto2_unittest::TestAllTypesLite>_2 *paVar1;
  Arena *__tmp;
  Nonnull<const_char_*> failure_msg;
  Map<int,_proto2_unittest::TestAllTypesLite> swapped_map;
  Map<int,_proto2_unittest::TestAllTypesLite> local_28;
  
  v1 = *(void **)((long)&this->field_0 + 0x18);
  if (v1 == (void *)0x0) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                            (v1,(void *)0x0,"map_.arena() == nullptr");
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    local_28.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.arena_ =
         *(Arena **)((long)&this->field_0 + 0x18);
    local_28.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_elements_ =
         (this->field_0).map_.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_elements_;
    (this->field_0).map_.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_elements_ = 0;
    local_28.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_buckets_ =
         (this->field_0).map_.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_buckets_;
    (this->field_0).map_.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.num_buckets_ = 1;
    local_28.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.index_of_first_non_null_ =
         (this->field_0).map_.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.
         index_of_first_non_null_;
    (this->field_0).map_.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.
    index_of_first_non_null_ = 1;
    local_28.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.type_info_ =
         (this->field_0).map_.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.type_info_;
    paVar1 = &this->field_0;
    (((KeyMapBase<unsigned_int> *)paVar1)->super_UntypedMapBase).type_info_.node_size = 0x358;
    (((KeyMapBase<unsigned_int> *)paVar1)->super_UntypedMapBase).type_info_.value_offset = '\x10';
    (((KeyMapBase<unsigned_int> *)paVar1)->super_UntypedMapBase).type_info_.field_0x3 = 0x61;
    local_28.super_KeyMapBase<unsigned_int>.super_UntypedMapBase.table_ =
         *(NodeBase ***)((long)&this->field_0 + 0x10);
    *(undefined8 **)((long)&this->field_0 + 0x10) = &kGlobalEmptyTable;
    Map<int,_proto2_unittest::TestAllTypesLite>::~Map(&local_28);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field_lite.h"
             ,0x37,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

~MapFieldLite() {
    ABSL_DCHECK_EQ(map_.arena(), nullptr);
    // We want to destruct the map in such a way that we can verify
    // that we've done that, but also be sure that we've deallocated
    // everything (as opposed to leaving an allocation behind with no
    // data in it, as would happen if a vector was resize'd to zero.
    // Map::Swap with an empty map accomplishes that.
    decltype(map_) swapped_map(map_.arena());
    map_.InternalSwap(&swapped_map);
  }